

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  Result RVar6;
  PolicyStatus PVar7;
  TargetType TVar8;
  cmGeneratorTarget *pcVar9;
  string *psVar10;
  ostream *poVar11;
  cmLinkInterfaceLibraries *libraries;
  cmLinkImplementationLibraries *libraries_00;
  size_t sVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  cmGeneratorExpressionDAGChecker *this_00;
  cmGeneratorTarget *target;
  string propertyName;
  string linkedTargetsContent;
  string interfacePropertyName;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget *local_270;
  string local_268;
  string local_248;
  cmGeneratorExpressionDAGChecker *local_228;
  string local_220;
  string local_200;
  char *local_1e0;
  cmListFileBacktrace local_1d8;
  string local_1c8;
  undefined1 local_1a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  
  if (1 < ((long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,
               "$<TARGET_PROPERTY:...> expression requires one or two parameters","");
    reportError(context,(string *)local_1a8,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar5 != 0)) {
    Evaluate::propertyNameValidator.regmatch.startp[0] = (char *)0x0;
    Evaluate::propertyNameValidator.regmatch.endp[0] = (char *)0x0;
    Evaluate::propertyNameValidator.regmatch.searchstring = (char *)0x0;
    Evaluate::propertyNameValidator.program = (char *)0x0;
    cmsys::RegularExpression::compile(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  local_270 = context->HeadTarget;
  pbVar2 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,pcVar3,pcVar3 + pbVar2->_M_string_length);
  pbVar2 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  lVar15 = lVar14 >> 5;
  if (lVar15 == 1) {
    context->HadHeadSensitiveCondition = true;
    if (local_270 != (cmGeneratorTarget *)0x0) {
      if (lVar14 == 0x40) goto LAB_003b5c81;
      goto LAB_003b5d52;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,
               "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
               ,"");
    reportError(context,(string *)local_1a8,&local_248);
  }
  else if (lVar15 == 2) {
LAB_003b5c81:
    if (pbVar2->_M_string_length != 0) {
      paVar1 = &local_248.field_2;
      pcVar3 = (pbVar2->_M_dataplus)._M_p;
      local_248._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar3,pcVar3 + pbVar2->_M_string_length);
      std::__cxx11::string::_M_assign((string *)&local_268);
      bVar4 = cmGeneratorExpression::IsValidTargetName(&local_248);
      if (bVar4) {
        if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
             ::propALIASED_TARGET_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                         ::propALIASED_TARGET_abi_cxx11_), iVar5 != 0)) {
          Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
          ::propALIASED_TARGET_abi_cxx11_._M_dataplus._M_p =
               (pointer)&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propALIASED_TARGET_abi_cxx11_.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                      ::propALIASED_TARGET_abi_cxx11_,"ALIASED_TARGET","");
          __cxa_atexit(std::__cxx11::string::~string,
                       &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                        ::propALIASED_TARGET_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                               ::propALIASED_TARGET_abi_cxx11_);
        }
        if ((local_268._M_string_length ==
             Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
             ::propALIASED_TARGET_abi_cxx11_._M_string_length) &&
           ((local_268._M_string_length == 0 ||
            (iVar5 = bcmp(local_268._M_dataplus._M_p,
                          Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                          ::propALIASED_TARGET_abi_cxx11_._M_dataplus._M_p,
                          local_268._M_string_length), iVar5 == 0)))) {
          bVar4 = cmMakefile::IsAlias(context->LG->Makefile,&local_248);
          if ((bVar4) &&
             (pcVar9 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_248),
             pcVar9 != (cmGeneratorTarget *)0x0)) {
            psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar9);
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar3 = (psVar10->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar10->_M_string_length);
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
          }
        }
        else {
          local_270 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_248);
          if (local_270 != (cmGeneratorTarget *)0x0) {
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)&context->AllTargets,&local_270);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != paVar1) {
              operator_delete(local_248._M_dataplus._M_p,
                              CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                       local_248.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_003b5d52;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_248._M_dataplus._M_p,
                               local_248._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" not found.",0xc);
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_220,content);
          std::__cxx11::stringbuf::str();
          reportError(context,&local_220,&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,
                            CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                     local_220.field_2._M_local_buf[0]) + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)&local_138);
        }
      }
      else {
        bVar4 = cmsys::RegularExpression::find
                          (&Evaluate::propertyNameValidator,local_268._M_dataplus._M_p,
                           &Evaluate::propertyNameValidator.regmatch);
        if (bVar4) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_220,"Target name not supported.","");
          reportError(context,(string *)local_1a8,&local_220);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_220,"Target name and property name not supported.","");
          reportError(context,(string *)local_1a8,&local_220);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,
                          CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                   local_220.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_003b6e72;
    }
    if (pbVar2[1]._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name and property name."
                 ,"");
      reportError(context,(string *)local_1a8,&local_248);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name.","");
      reportError(context,(string *)local_1a8,&local_248);
    }
  }
  else {
LAB_003b5d52:
    if (local_270 == context->HeadTarget) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&context->SeenTargetProperties,&local_268);
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_268);
    if (iVar5 == 0) {
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->SourceSensitiveTargets,&local_270);
    }
    if (local_268._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,
                 "$<TARGET_PROPERTY:...> expression requires a non-empty property name.","");
      reportError(context,(string *)local_1a8,&local_248);
    }
    else {
      bVar4 = cmsys::RegularExpression::find
                        (&Evaluate::propertyNameValidator,local_268._M_dataplus._M_p,
                         &Evaluate::propertyNameValidator.regmatch);
      if (bVar4) {
        if (local_270 == (cmGeneratorTarget *)0x0) {
          __assert_fail("target",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                        ,0x516,
                        "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                       );
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_268);
        pcVar9 = local_270;
        if (iVar5 != 0) {
          local_1d8.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (context->Backtrace).TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_1d8.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (context->Backtrace).TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_1d8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1d8.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1d8.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1d8.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1d8.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,local_268._M_dataplus._M_p,
                     local_268._M_dataplus._M_p + local_268._M_string_length);
          cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                    ((cmGeneratorExpressionDAGChecker *)local_1a8,&local_1d8,pcVar9,&local_1c8,
                     content,dagCheckerParent);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if (local_1d8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1d8.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          RVar6 = cmGeneratorExpressionDAGChecker::Check
                            ((cmGeneratorExpressionDAGChecker *)local_1a8);
          if (RVar6 == SELF_REFERENCE) {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_248,content);
            cmGeneratorExpressionDAGChecker::ReportError
                      ((cmGeneratorExpressionDAGChecker *)local_1a8,context,&local_248);
LAB_003b66f8:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,
                              CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                       local_248.field_2._M_local_buf[0]) + 1);
            }
LAB_003b6713:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
          else {
            if (RVar6 == CYCLIC_REFERENCE) goto LAB_003b6713;
            local_228 = dagCheckerParent;
            if (RVar6 == ALREADY_SEEN) {
              lVar14 = 1;
              do {
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  __return_storage_ptr__->_M_string_length = 0;
                  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                  goto LAB_003b6e2f;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0xb);
            }
            local_1e0 = cmGeneratorTarget::GetProperty(local_270,&local_268);
            this_00 = local_228;
            if (((local_228 != (cmGeneratorExpressionDAGChecker *)0x0) &&
                (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(local_228),
                !bVar4)) &&
               (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(this_00), !bVar4))
            {
              bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                (this_00,(cmGeneratorTarget *)0x0);
              if (bVar4) {
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if ((((((iVar5 == 0) ||
                       (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0)) ||
                      ((iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0 ||
                       ((iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0 ||
                        (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0))))))
                     || (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0)) ||
                    (((((((iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0 ||
                          (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0))
                         || (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0))
                        || ((iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0
                            || (iVar5 = std::__cxx11::string::compare((char *)&local_268),
                               iVar5 == 0)))) ||
                       (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0)) ||
                      ((iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0 ||
                       (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0)))) ||
                     ((iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0 ||
                      (((iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0 ||
                        (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0)) ||
                       (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0)))))))
                    ) || ((iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0 ||
                          (iVar5 = std::__cxx11::string::compare((char *)&local_268), iVar5 == 0))))
                {
                  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_248,content);
                  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_220,
                             "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                             ,"");
                  reportError(context,&local_248,&local_220);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != &local_220.field_2) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                             local_220.field_2._M_local_buf[0]) + 1);
                  }
                  goto LAB_003b66f8;
                }
                if (local_1e0 == (char *)0x0) goto LAB_003b6713;
              }
              else {
                bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(this_00);
                if ((((!bVar4) &&
                     (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                        (this_00), !bVar4)) &&
                    ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(this_00)
                     , !bVar4 &&
                     (((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(this_00),
                       !bVar4 && (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                                    (this_00), !bVar4)) &&
                      (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(this_00), !bVar4))
                     )))) && (((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                                  (this_00), !bVar4 &&
                               (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions
                                                  (this_00), !bVar4)) &&
                              ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                                  (this_00), !bVar4 &&
                               (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends
                                                  (this_00), !bVar4)))))) {
                  __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                ,0x556,
                                "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                               );
                }
              }
            }
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            local_248._M_string_length = 0;
            local_248.field_2._M_local_buf[0] = '\0';
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            local_220._M_string_length = 0;
            local_220.field_2._M_local_buf[0] = '\0';
            iVar5 = std::__cxx11::string::compare((char *)&local_268);
            if (iVar5 == 0) {
              pcVar16 = "INTERFACE_INCLUDE_DIRECTORIES";
LAB_003b6b52:
              std::__cxx11::string::operator=((string *)&local_220,pcVar16);
LAB_003b6b5c:
              pcVar9 = local_270;
              if ((local_220._M_string_length != 0) &&
                 (libraries_00 = cmGeneratorTarget::GetLinkImplementationLibraries
                                           (local_270,&context->Config),
                 libraries_00 != (cmLinkImplementationLibraries *)0x0)) {
                getLinkedTargetsContent<cmLinkImplItem>
                          (&local_200,&libraries_00->Libraries,local_270,local_270,context,
                           (cmGeneratorExpressionDAGChecker *)local_1a8,&local_220);
LAB_003b6ba6:
                std::__cxx11::string::operator=((string *)&local_248,(string *)&local_200);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._M_dataplus._M_p != &local_200.field_2) {
                  operator_delete(local_200._M_dataplus._M_p,
                                  local_200.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              pcVar16 = "INTERFACE_INCLUDE_DIRECTORIES";
              iVar5 = std::__cxx11::string::compare((char *)&local_268);
              if (iVar5 != 0) {
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_COMPILE_DEFINITIONS";
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_COMPILE_DEFINITIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_COMPILE_OPTIONS";
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_COMPILE_OPTIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_AUTOUIC_OPTIONS";
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_AUTOUIC_OPTIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_SOURCES";
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_SOURCES";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_COMPILE_FEATURES";
                  this_00 = local_228;
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_COMPILE_FEATURES";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                this_00 = local_228;
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_LINK_OPTIONS";
                  this_00 = local_228;
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_LINK_OPTIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                this_00 = local_228;
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_LINK_DIRECTORIES";
                  this_00 = local_228;
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_LINK_DIRECTORIES";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                this_00 = local_228;
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_LINK_DEPENDS";
                  this_00 = local_228;
                  goto LAB_003b6b52;
                }
                pcVar16 = "INTERFACE_LINK_DEPENDS";
                iVar5 = std::__cxx11::string::compare((char *)&local_268);
                this_00 = local_228;
                if (iVar5 == 0) goto LAB_003b672b;
                iVar5 = strncmp(local_268._M_dataplus._M_p,"COMPILE_DEFINITIONS_",0x14);
                if ((iVar5 == 0) &&
                   (PVar7 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar7 < NEW)) {
                  std::__cxx11::string::operator=
                            ((string *)&local_220,"INTERFACE_COMPILE_DEFINITIONS");
                }
                goto LAB_003b6b5c;
              }
LAB_003b672b:
              std::__cxx11::string::operator=((string *)&local_220,pcVar16);
              pcVar9 = context->HeadTarget;
              if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
                pcVar9 = local_270;
              }
              libraries = cmGeneratorTarget::GetLinkInterfaceLibraries
                                    (local_270,&context->Config,pcVar9,true);
              if (libraries != (cmLinkInterfaceLibraries *)0x0) {
                getLinkedTargetsContent<cmLinkItem>
                          (&local_200,&libraries->Libraries,local_270,pcVar9,context,
                           (cmGeneratorExpressionDAGChecker *)local_1a8,&local_220);
                goto LAB_003b6ba6;
              }
            }
            if (local_1e0 == (char *)0x0) {
              bVar4 = cmGeneratorTarget::IsImported(local_270);
              if ((bVar4) ||
                 (TVar8 = cmGeneratorTarget::GetType(local_270), TVar8 == INTERFACE_LIBRARY)) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p == &local_248.field_2) {
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                local_248.field_2._M_local_buf[0]);
                  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                       local_248.field_2._8_8_;
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p = local_248._M_dataplus._M_p;
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                local_248.field_2._M_local_buf[0]);
                }
                __return_storage_ptr__->_M_string_length = local_248._M_string_length;
                local_248._M_string_length = 0;
                local_248.field_2._M_local_buf[0] = '\0';
                local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              }
              else {
                psVar10 = &context->Config;
                bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                  (local_270,&local_268,psVar10);
                if (bVar4) {
                  context->HadContextSensitiveCondition = true;
                  bVar4 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                    (local_270,&local_268,psVar10);
                  pcVar16 = "0";
                  if (bVar4) {
                    pcVar16 = "1";
                  }
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  pcVar13 = "";
                  if (bVar4) {
                    pcVar13 = "";
                  }
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,pcVar16,pcVar13);
                }
                else {
                  bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                    (local_270,&local_268,psVar10);
                  if (bVar4) {
                    context->HadContextSensitiveCondition = true;
                    pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                        (local_270,&local_268,psVar10);
                    pcVar16 = "";
                    if (pcVar13 != (char *)0x0) {
                      pcVar16 = pcVar13;
                    }
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    sVar12 = strlen(pcVar16);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                  }
                  else {
                    bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                      (local_270,&local_268,psVar10);
                    if (bVar4) {
                      context->HadContextSensitiveCondition = true;
                      pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                          (local_270,&local_268,psVar10);
                      pcVar16 = "";
                      if (pcVar13 != (char *)0x0) {
                        pcVar16 = pcVar13;
                      }
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      sVar12 = strlen(pcVar16);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                    }
                    else {
                      bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                        (local_270,&local_268,psVar10);
                      if (bVar4) {
                        context->HadContextSensitiveCondition = true;
                        pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                            (local_270,&local_268,psVar10);
                        pcVar16 = "";
                        if (pcVar13 != (char *)0x0) {
                          pcVar16 = pcVar13;
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        sVar12 = strlen(pcVar16);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                      }
                      else {
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_248._M_dataplus._M_p == &local_248.field_2) {
                          (__return_storage_ptr__->field_2)._M_allocated_capacity =
                               CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                        local_248.field_2._M_local_buf[0]);
                          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                               local_248.field_2._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->_M_dataplus)._M_p = local_248._M_dataplus._M_p;
                          (__return_storage_ptr__->field_2)._M_allocated_capacity =
                               CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                        local_248.field_2._M_local_buf[0]);
                        }
                        __return_storage_ptr__->_M_string_length = local_248._M_string_length;
                        local_248._M_string_length = 0;
                        local_248.field_2._M_local_buf[0] = '\0';
                        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                      }
                    }
                  }
                }
              }
            }
            else {
              bVar4 = cmGeneratorTarget::IsImported(local_270);
              if ((this_00 == (cmGeneratorExpressionDAGChecker *)0x0 || bVar4) ||
                 (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                    (this_00,(cmGeneratorTarget *)0x0), bVar4)) {
LAB_003b6c0e:
                pcVar16 = local_1e0;
                if (local_220._M_string_length == 0) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  sVar12 = strlen(local_1e0);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                }
                else {
                  paVar1 = &local_200.field_2;
                  local_200._M_dataplus._M_p = (pointer)paVar1;
                  sVar12 = strlen(local_1e0);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_200,pcVar16,pcVar16 + sVar12);
                  cmGeneratorExpressionNode::EvaluateDependentExpression
                            (__return_storage_ptr__,&local_200,context->LG,context,pcVar9,local_270,
                             (cmGeneratorExpressionDAGChecker *)local_1a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_200._M_dataplus._M_p != paVar1) {
                    operator_delete(local_200._M_dataplus._M_p,
                                    local_200.field_2._M_allocated_capacity + 1);
                  }
                  if (local_248._M_string_length != 0) {
                    pcVar16 = ";";
                    if (__return_storage_ptr__->_M_string_length == 0) {
                      pcVar16 = "";
                    }
                    std::operator+(&local_200,pcVar16,&local_248);
                    std::__cxx11::string::_M_append
                              ((char *)__return_storage_ptr__,(ulong)local_200._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_200._M_dataplus._M_p != paVar1) {
                      operator_delete(local_200._M_dataplus._M_p,
                                      local_200.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              else {
                psVar10 = &context->Config;
                bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                  (local_270,&local_268,psVar10);
                if (bVar4) {
                  context->HadContextSensitiveCondition = true;
                  pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                      (local_270,&local_268,psVar10);
                  pcVar16 = "";
                  if (pcVar13 != (char *)0x0) {
                    pcVar16 = pcVar13;
                  }
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  sVar12 = strlen(pcVar16);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                }
                else {
                  bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                    (local_270,&local_268,psVar10);
                  if (!bVar4) goto LAB_003b6c0e;
                  context->HadContextSensitiveCondition = true;
                  pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                      (local_270,&local_268,psVar10);
                  pcVar16 = "";
                  if (pcVar13 != (char *)0x0) {
                    pcVar16 = pcVar13;
                  }
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  sVar12 = strlen(pcVar16);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,
                              CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                       local_220.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,
                              CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                       local_248.field_2._M_local_buf[0]) + 1);
            }
          }
LAB_003b6e2f:
          if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
          }
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&local_178);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._16_8_ != &local_188) {
            operator_delete((void *)local_1a8._16_8_,local_188._M_allocated_capacity + 1);
          }
          goto LAB_003b6e72;
        }
        TVar8 = cmGeneratorTarget::GetType(local_270);
        if (((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
            (TVar8 != STATIC_LIBRARY)) ||
           ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                               (dagCheckerParent,(cmGeneratorTarget *)0x0), !bVar4 &&
            (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), !bVar4)))
           ) {
          cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,local_270,&context->Config);
          goto LAB_003b6e72;
        }
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,
                   "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                   ,"");
        reportError(context,(string *)local_1a8,&local_248);
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"Property name not supported.","");
        reportError(context,(string *)local_1a8,&local_248);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_003b6e72:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    if (parameters.size() != 1 && parameters.size() != 2) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = context->HeadTarget;
    std::string propertyName = parameters.front();

    if (parameters.size() == 1) {
      context->HadHeadSensitiveCondition = true;
    }
    if (!target && parameters.size() == 1) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
        "It may not be used with add_custom_command or add_custom_target.  "
        "Specify the target to read a property from using the "
        "$<TARGET_PROPERTY:tgt,prop> signature instead.");
      return std::string();
    }

    if (parameters.size() == 2) {
      if (parameters.front().empty() && parameters[1].empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name and property name.");
        return std::string();
      }
      if (parameters.front().empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name.");
        return std::string();
      }

      std::string targetName = parameters.front();
      propertyName = parameters[1];
      if (!cmGeneratorExpression::IsValidTargetName(targetName)) {
        if (!propertyNameValidator.find(propertyName)) {
          ::reportError(context, content->GetOriginalExpression(),
                        "Target name and property name not supported.");
          return std::string();
        }
        ::reportError(context, content->GetOriginalExpression(),
                      "Target name not supported.");
        return std::string();
      }
      static const std::string propALIASED_TARGET = "ALIASED_TARGET";
      if (propertyName == propALIASED_TARGET) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return "";
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);
    }

    if (target == context->HeadTarget) {
      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);
    }
    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        for (size_t i = 1; i < cm::size(targetPropertyTransitiveWhitelist);
             ++i) {
          if (targetPropertyTransitiveWhitelist[i] == propertyName) {
            // No error. We're not going to find anything new here.
            return std::string();
          }
        }
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    const char* prop = target->GetProperty(propertyName);

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY)                                 \
  (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(
              TRANSITIVE_PROPERTY_COMPARE) false) { // NOLINT(*)
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
#undef TRANSITIVE_PROPERTY_COMPARE

        if (!prop) {
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||

        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
      context->HeadTarget && isInterfaceProperty ? context->HeadTarget
                                                 : target;

    if (isInterfaceProperty) {
      if (cmLinkInterfaceLibraries const* iface =
            target->GetLinkInterfaceLibraries(context->Config, headTarget,
                                              true)) {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target, headTarget,
                                  context, &dagChecker, interfacePropertyName);
      }
    } else if (!interfacePropertyName.empty()) {
      if (cmLinkImplementationLibraries const* impl =
            target->GetLinkImplementationLibraries(context->Config)) {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target, target, context,
                                  &dagChecker, interfacePropertyName);
      }
    }

    if (!prop) {
      if (target->IsImported() ||
          target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        return linkedTargetsContent;
      }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }

      return linkedTargetsContent;
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }
    if (!interfacePropertyName.empty()) {
      std::string result = this->EvaluateDependentExpression(
        prop, context->LG, context, headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
      return result;
    }
    return prop;
  }